

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

optional<slang::TimeScale> __thiscall slang::TimeScale::fromString(TimeScale *this,string_view str)

{
  char *pcVar1;
  TimeScale *pTVar2;
  optional<slang::TimeScaleValue> oVar3;
  optional<slang::TimeScaleValue> oVar4;
  uint uVar5;
  TimeScale *pTVar6;
  undefined5 extraout_var;
  byte bVar7;
  TimeScale *extraout_RDX;
  TimeScale *extraout_RDX_00;
  bool bVar8;
  string_view str_00;
  TimeScale *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  str_00._M_str = (char *)str._M_len;
  local_30._M_str = str_00._M_str;
  local_30._M_len = (size_t)this;
  str_00._M_len = (size_t)this;
  oVar3 = parseValue(str_00,(size_t *)&local_38);
  pTVar2 = extraout_RDX;
  if (((uint3)oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) != 0) {
    for (; pTVar2 = extraout_RDX, local_38 < this;
        local_38 = (TimeScale *)&(local_38->base).magnitude) {
      if (str_00._M_str[(long)local_38] != ' ') {
        pTVar6 = local_38;
        pTVar2 = extraout_RDX;
        if (str_00._M_str[(long)local_38] == '/') goto LAB_003680ec;
        break;
      }
    }
  }
  goto LAB_00368131;
  while (pcVar1 = str_00._M_str + 1 + (long)pTVar6, pTVar6 = local_38, *pcVar1 == ' ') {
LAB_003680ec:
    local_38 = (TimeScale *)&(pTVar6->base).magnitude;
    pTVar2 = extraout_RDX;
    if (this <= local_38) goto LAB_00368131;
  }
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_30,(size_type)local_38,0xffffffffffffffff);
  oVar4 = parseValue(local_30,(size_t *)&local_38);
  uVar5 = (uint)CONCAT53(extraout_var,
                         oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::TimeScaleValue>);
  pTVar2 = extraout_RDX_00;
  if ((uVar5 >> 0x10 & 1) != 0) {
    bVar7 = 0;
    if (local_38 != (TimeScale *)local_30._M_len) goto LAB_00368133;
    bVar8 = oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_ <
            oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_;
    if (oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_ ==
        oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_) {
      local_38 = (TimeScale *)
                 (CONCAT53(extraout_var,
                           oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::TimeScaleValue>) >> 8 & 0xffffff);
      bVar8 = (byte)local_38 <
              oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_;
      if ((byte)local_38 !=
          oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_) goto LAB_00368170;
    }
    else {
LAB_00368170:
      pTVar2 = local_38;
      if ('\0' < (char)(-bVar8 | 1U)) goto LAB_00368131;
    }
    local_38 = (TimeScale *)
               (ulong)((uint3)oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>.
                              _M_payload.super__Optional_payload_base<slang::TimeScaleValue> &
                       0xffff | uVar5 << 0x10);
    bVar7 = 1;
    goto LAB_00368133;
  }
LAB_00368131:
  local_38 = pTVar2;
  bVar7 = 0;
LAB_00368133:
  return (_Optional_base<slang::TimeScale,_true,_true>)
         ((uint5)local_38 & 0xffffffff | (uint5)bVar7 << 0x20);
}

Assistant:

std::optional<TimeScale> TimeScale::fromString(std::string_view str) {
    size_t idx;
    auto base = parseValue(str, idx);
    if (!base)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size() || str[idx] != '/')
        return {};

    do {
        idx++;
    } while (idx < str.size() && str[idx] == ' ');

    if (idx >= str.size())
        return {};

    str = str.substr(idx);
    auto precision = parseValue(str, idx);
    if (!precision || idx != str.length())
        return {};

    // Precision can't be a larger unit of time than the base.
    if (*precision > *base)
        return {};

    return TimeScale(*base, *precision);
}